

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O1

int process_single_source
              (string *file_name,string *source_code,string *sqconfig_file_name,bool use_csq,
              bool collect_ident_tree)

{
  undefined8 *puVar1;
  _Rb_tree_header *p_Var2;
  char *pcVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  Node *node;
  undefined8 *puVar13;
  long *plVar14;
  uint uVar15;
  size_type *psVar16;
  string *psVar17;
  long *plVar18;
  _Base_ptr *pp_Var19;
  ulong uVar20;
  char *__s1;
  uint __len;
  uint uVar21;
  char *local_498;
  char *local_490;
  string sqconfigFileName;
  undefined8 *local_458;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  long *local_438;
  long local_430;
  long local_428;
  long lStack_420;
  ulong *local_418;
  long local_410;
  ulong local_408 [2];
  string *local_3f8;
  string *local_3f0;
  string *local_3e8;
  ulong *local_3e0;
  long local_3d8;
  ulong local_3d0 [2];
  Lexer lex;
  long *local_358;
  long local_350;
  long local_348;
  long lStack_340;
  CompilationContext ctx;
  ifstream tmp;
  undefined4 uStack_234;
  _Base_ptr local_228;
  _Base_ptr p_Stack_220;
  uint auStack_218 [50];
  undefined8 auStack_150 [36];
  
  CompilationContext::CompilationContext(&ctx);
  _tmp = (_Base_ptr *)CONCAT44(uStack_234,1);
  if (argc__ < 2) {
    bVar9 = false;
    bVar6 = false;
    local_490 = "";
    local_498 = "";
    bVar8 = false;
  }
  else {
    iVar10 = 1;
    bVar8 = false;
    local_498 = "";
    local_490 = "";
    bVar6 = false;
    bVar9 = false;
    local_3f8 = source_code;
    local_3f0 = file_name;
    local_3e8 = sqconfig_file_name;
    do {
      pcVar3 = argv__[iVar10];
      iVar10 = strcmp("-duplucate-if-expression",pcVar3);
      __s1 = "-duplicate-if-expression";
      if (iVar10 != 0) {
        __s1 = pcVar3;
      }
      iVar10 = strncmp(__s1,"--tokens-output-file:",0x15);
      if (iVar10 == 0) {
        local_490 = __s1 + 0x15;
        bVar9 = true;
LAB_00119888:
        bVar5 = true;
      }
      else {
        iVar10 = strncmp(__s1,"--ast-output-file:",0x12);
        if (iVar10 == 0) {
          local_498 = __s1 + 0x12;
          bVar6 = true;
          goto LAB_00119888;
        }
        iVar10 = strcmp(__s1,"--inverse-warnings");
        if (iVar10 == 0) {
          bVar5 = true;
          bVar8 = true;
        }
        else {
          iVar10 = strncmp(__s1,"--csq-exe:",10);
          pcVar3 = DAT_0013d3b8;
          if (iVar10 == 0) {
            strlen(__s1 + 10);
            bVar5 = true;
            std::__cxx11::string::_M_replace(0x13d3b0,0,pcVar3,(ulong)(__s1 + 10));
          }
          else {
            iVar10 = strncmp(__s1,"--output-mode:",0xe);
            if (iVar10 == 0) {
              ctx.outputMode = str_to_output_mode(__s1 + 0xe);
              goto LAB_00119888;
            }
            if (*__s1 == '-') {
              iVar10 = toupper((int)__s1[1]);
              if ((iVar10 == 0x57) && ((int)__s1[2] - 0x30U < 10)) {
                iVar10 = atoi(__s1 + 2);
                bVar5 = true;
                CompilationContext::suppressWaring(&ctx,iVar10);
              }
              else {
                iVar10 = isalpha((int)__s1[1]);
                if (iVar10 == 0) goto LAB_0011994c;
                bVar5 = true;
                CompilationContext::suppressWaring(&ctx,__s1 + 1);
              }
            }
            else {
LAB_0011994c:
              bVar5 = false;
            }
          }
        }
      }
      if (bVar5) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &used_args,(int *)&tmp);
      }
      iVar10 = _tmp + 1;
      _tmp = (_Base_ptr *)CONCAT44(uStack_234,iVar10);
      file_name = local_3f0;
      sqconfig_file_name = local_3e8;
      source_code = local_3f8;
    } while (iVar10 < argc__);
  }
  if (bVar8) {
    CompilationContext::inverseWarningsSuppression(&ctx);
  }
  bVar8 = CompilationContext::isWarningSuppressed(&ctx,"undefined-variable");
  if ((bVar8) && (bVar8 = CompilationContext::isWarningSuppressed(&ctx,"never-declared"), bVar8)) {
    variable_presense_check = false;
  }
  else {
    variable_presense_check = (bool)(~collect_ident_tree & use_csq);
  }
  if (file_name->_M_string_length == 0) {
    uVar21 = 1;
    CompilationContext::globalError("Expected file name");
    goto LAB_0011a2e0;
  }
  if (source_code->_M_string_length == 0) {
    std::ifstream::ifstream(&tmp,(string *)file_name,_S_in);
    uVar12 = *(uint *)((long)auStack_218 + (long)_tmp[-3]);
    if ((uVar12 & 5) == 0) {
      p_Var2 = &lex.tokenIdentStringToType._M_t._M_impl.super__Rb_tree_header;
      lex.s = (string *)p_Var2;
      std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)&lex,*(undefined8 *)((long)auStack_150 + (long)_tmp[-3]),0xffffffff);
      std::__cxx11::string::operator=((string *)&ctx.code,(string *)&lex);
      if ((_Rb_tree_header *)lex.s != p_Var2) {
        operator_delete(lex.s);
      }
    }
    else {
      local_438 = &local_428;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"Cannot open file \'","")
      ;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_438);
      psVar16 = (size_type *)(plVar14 + 2);
      if ((size_type *)*plVar14 == psVar16) {
        sqconfigFileName.field_2._M_allocated_capacity = *psVar16;
        sqconfigFileName.field_2._8_8_ = plVar14[3];
        sqconfigFileName._M_dataplus._M_p = (pointer)&sqconfigFileName.field_2;
      }
      else {
        sqconfigFileName.field_2._M_allocated_capacity = *psVar16;
        sqconfigFileName._M_dataplus._M_p = (pointer)*plVar14;
      }
      sqconfigFileName._M_string_length = plVar14[1];
      *plVar14 = (long)psVar16;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&sqconfigFileName);
      p_Var2 = &lex.tokenIdentStringToType._M_t._M_impl.super__Rb_tree_header;
      psVar17 = (string *)(plVar14 + 2);
      if ((string *)*plVar14 == psVar17) {
        lex.tokenIdentStringToType._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             (psVar17->_M_dataplus)._M_p;
        lex.tokenIdentStringToType._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)plVar14[3];
        lex.s = (string *)p_Var2;
      }
      else {
        lex.tokenIdentStringToType._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             (psVar17->_M_dataplus)._M_p;
        lex.s = (string *)*plVar14;
      }
      lex.tokenIdentStringToType._M_t._M_impl._0_8_ = plVar14[1];
      *plVar14 = (long)psVar17;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      CompilationContext::globalError((char *)lex.s);
      if ((_Rb_tree_header *)lex.s != p_Var2) {
        operator_delete(lex.s);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sqconfigFileName._M_dataplus._M_p != &sqconfigFileName.field_2) {
        operator_delete(sqconfigFileName._M_dataplus._M_p);
      }
      if (local_438 != &local_428) {
        operator_delete(local_438);
      }
    }
    std::ifstream::~ifstream(&tmp);
    uVar21 = 1;
    if ((uVar12 & 5) != 0) goto LAB_0011a2e0;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&ctx.code);
  }
  CompilationContext::setFileName(&ctx,file_name);
  if (sqconfig_file_name->_M_string_length == 0) {
    settings::search_sqconfig_abi_cxx11_
              (&sqconfigFileName,(settings *)(file_name->_M_dataplus)._M_p,(char *)0x0);
  }
  else {
    sqconfigFileName._M_dataplus._M_p = (pointer)&sqconfigFileName.field_2;
    pcVar4 = (sqconfig_file_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sqconfigFileName,pcVar4,pcVar4 + sqconfig_file_name->_M_string_length);
  }
  if ((sqconfigFileName._M_string_length == DAT_0013d488) &&
     ((sqconfigFileName._M_string_length == 0 ||
      (iVar10 = bcmp(sqconfigFileName._M_dataplus._M_p,settings::cur_config_file_name_abi_cxx11_,
                     sqconfigFileName._M_string_length), iVar10 == 0)))) {
    uVar21 = 1;
    if (settings::cur_config_file_failed == '\0') goto LAB_00119b66;
  }
  else {
    settings::reset();
    if (sqconfigFileName._M_string_length != 0) {
      bVar8 = settings::append_from_file(sqconfigFileName._M_dataplus._M_p);
      uVar21 = 1;
      if (!bVar8) goto LAB_0011a2cd;
    }
LAB_00119b66:
    if (variable_presense_check == true) {
      moduleexports::module_export_collector(&ctx,0,0,(char *)0x0);
    }
    iVar10 = strncmp(ctx.code._M_dataplus._M_p,"//expect:error",0xe);
    iVar11 = strncmp(ctx.code._M_dataplus._M_p,"//expect:w",10);
    uVar12 = 0;
    if (iVar11 == 0) {
      uVar12 = atoi(ctx.code._M_dataplus._M_p + 10);
    }
    if (uVar12 != 0 || iVar10 == 0) {
      CompilationContext::clearSuppressedWarnings(&ctx);
    }
    if (bVar9) {
      if (CompilationContext::redirectMessagesToJson == (char *)0x0) {
LAB_00119c10:
        CompilationContext::clearSuppressedWarnings(&ctx);
        CompilationContext::inverseWarningsSuppression(&ctx);
      }
    }
    else if ((bool)(bVar6 & CompilationContext::redirectMessagesToJson == (char *)0x0))
    goto LAB_00119c10;
    bVar8 = process_import(&ctx);
    uVar21 = 1;
    if (bVar8) {
      Lexer::Lexer(&lex,&ctx);
      bVar8 = Lexer::process(&lex);
      if (bVar9) {
        bVar9 = tokens_to_json(local_490,&lex);
        bVar8 = bVar8 && bVar9;
      }
      if (bVar8 == false) {
LAB_00119eea:
        if ((ctx.isError != false) || (ctx.isWarning == true)) {
          bVar8 = false;
        }
        if (iVar10 == 0 && ctx.isError == false) {
          uVar21 = 1;
          CompilationContext::globalError("Expected error.");
        }
        else if ((uVar12 == 0) ||
                (((ctx.isWarning == true &&
                  ((long)ctx.shownWarningsAndErrors.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)ctx.shownWarningsAndErrors.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start == 4)) &&
                 (*ctx.shownWarningsAndErrors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start == uVar12)))) {
          if (uVar12 == 0 && iVar10 != 0) {
            uVar21 = (uint)(bVar8 ^ 1);
          }
          else {
            iVar10 = CompilationContext::getErrorLevel();
            uVar21 = 0;
            if (iVar10 != 4) {
              CompilationContext::clearErrorLevel();
              uVar21 = 0;
            }
          }
        }
        else {
          local_3e0 = local_3d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3e0,"Expected only one warning \'w","");
          uVar21 = -uVar12;
          if (0 < (int)uVar12) {
            uVar21 = uVar12;
          }
          __len = 1;
          if (9 < uVar21) {
            uVar20 = (ulong)uVar21;
            uVar7 = 4;
            do {
              __len = uVar7;
              uVar15 = (uint)uVar20;
              if (uVar15 < 100) {
                __len = __len - 2;
                goto LAB_0011a003;
              }
              if (uVar15 < 1000) {
                __len = __len - 1;
                goto LAB_0011a003;
              }
              if (uVar15 < 10000) goto LAB_0011a003;
              uVar20 = uVar20 / 10000;
              uVar7 = __len + 4;
            } while (99999 < uVar15);
            __len = __len + 1;
          }
LAB_0011a003:
          local_418 = local_408;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_418,(char)__len - (char)((int)uVar12 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar12 >> 0x1f) + (long)local_418),__len,uVar21);
          uVar20 = 0xf;
          if (local_3e0 != local_3d0) {
            uVar20 = local_3d0[0];
          }
          if (uVar20 < (ulong)(local_410 + local_3d8)) {
            uVar20 = 0xf;
            if (local_418 != local_408) {
              uVar20 = local_408[0];
            }
            if (uVar20 < (ulong)(local_410 + local_3d8)) goto LAB_0011a08d;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_418,0,(char *)0x0,(ulong)local_3e0);
          }
          else {
LAB_0011a08d:
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_3e0,(ulong)local_418);
          }
          local_458 = &local_448;
          puVar1 = puVar13 + 2;
          if ((undefined8 *)*puVar13 == puVar1) {
            local_448 = *puVar1;
            uStack_440 = puVar13[3];
          }
          else {
            local_448 = *puVar1;
            local_458 = (undefined8 *)*puVar13;
          }
          local_450 = puVar13[1];
          *puVar13 = puVar1;
          puVar13[1] = 0;
          *(undefined1 *)puVar1 = 0;
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_458);
          plVar18 = plVar14 + 2;
          if ((long *)*plVar14 == plVar18) {
            local_348 = *plVar18;
            lStack_340 = plVar14[3];
            local_358 = &local_348;
          }
          else {
            local_348 = *plVar18;
            local_358 = (long *)*plVar14;
          }
          local_350 = plVar14[1];
          *plVar14 = (long)plVar18;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_358,(ulong)ctx.fileName._M_dataplus._M_p);
          plVar18 = plVar14 + 2;
          if ((long *)*plVar14 == plVar18) {
            local_428 = *plVar18;
            lStack_420 = plVar14[3];
            local_438 = &local_428;
          }
          else {
            local_428 = *plVar18;
            local_438 = (long *)*plVar14;
          }
          local_430 = plVar14[1];
          *plVar14 = (long)plVar18;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_438);
          pp_Var19 = (_Base_ptr *)(plVar14 + 2);
          if ((_Base_ptr *)*plVar14 == pp_Var19) {
            local_228 = *pp_Var19;
            p_Stack_220 = (_Base_ptr)plVar14[3];
            _tmp = &local_228;
          }
          else {
            local_228 = *pp_Var19;
            _tmp = (_Base_ptr *)*plVar14;
          }
          *plVar14 = (long)pp_Var19;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          CompilationContext::globalError((char *)_tmp);
          if (_tmp != &local_228) {
            operator_delete(_tmp);
          }
          if (local_438 != &local_428) {
            operator_delete(local_438);
          }
          if (local_358 != &local_348) {
            operator_delete(local_358);
          }
          if (local_458 != &local_448) {
            operator_delete(local_458);
          }
          if (local_418 != local_408) {
            operator_delete(local_418);
          }
          if (local_3e0 != local_3d0) {
            operator_delete(local_3e0);
          }
          uVar21 = 1;
        }
      }
      else {
        node = sq3_parse(&lex);
        if (bVar6) {
          bVar8 = ast_to_json(local_498,node);
          bVar8 = bVar8 && ctx.isError == false;
        }
        uVar21 = 1;
        bVar9 = true;
        if (ctx.isError == false) {
          bVar9 = true;
          if (collect_ident_tree) {
            if (node != (Node *)0x0) {
              collect_ever_declared(&lex);
              global_collect_tree(node,&ident_root);
              uVar21 = 0;
              bVar9 = false;
            }
          }
          else {
            Analyzer::Analyzer((Analyzer *)&tmp,&lex);
            if (node != (Node *)0x0) {
              collect_ever_declared(&lex);
              Analyzer::collectGlobalTables((Analyzer *)&tmp,node);
              Analyzer::check((Analyzer *)&tmp,node);
              Analyzer::checkVariables
                        ((Analyzer *)&tmp,node,0,0x3fffffff,false,false,false,false,1,false);
            }
            Analyzer::~Analyzer((Analyzer *)&tmp);
          }
        }
        if (bVar9) goto LAB_00119eea;
      }
      if (lex.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(lex.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>_>
      ::~_Rb_tree(&lex.tokenIdentStringToType._M_t);
    }
  }
LAB_0011a2cd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sqconfigFileName._M_dataplus._M_p != &sqconfigFileName.field_2) {
    operator_delete(sqconfigFileName._M_dataplus._M_p);
  }
LAB_0011a2e0:
  CompilationContext::~CompilationContext(&ctx);
  return uVar21;
}

Assistant:

int process_single_source(const string & file_name, const string & source_code, const string & sqconfig_file_name,
  bool use_csq, bool collect_ident_tree)
{
  CompilationContext ctx;

  if (collect_ident_tree)
    use_csq = false;

  bool inverseWarnings = false;
  bool printAst = false;

  bool printTokensToJson = false;
  bool printAstToJson = false;
  const char * tokensFileName = "";
  const char * astFileName = "";

  for (int i = 1; i < argc__; i++)
  {
    const char * arg = argv__[i];
    bool used = true;

    {
      // HACK: fix "duplucate-if-expression" -> "duplicate-if-expression", and support old config files
      if (!strcmp("-duplucate-if-expression", arg))
        arg = "-duplicate-if-expression";
    }

    if (!strncmp(arg, "--tokens-output-file:", 21))
    {
      printTokensToJson = true;
      tokensFileName = arg + 21;
    }
    else if (!strncmp(arg, "--ast-output-file:", 18))
    {
      printAstToJson = true;
      astFileName = arg + 18;
    }
    else if (!strcmp(arg, "--inverse-warnings"))
      inverseWarnings = true;
    else if (!strncmp(arg, "--csq-exe:", 10))
      moduleexports::csq_exe = arg + 10;
//    else if (!strcmp(arg, "--print-ast"))  // deprecated
//      printAst = true;
    else if (!strncmp(arg, "--output-mode:", 14))
      ctx.outputMode = str_to_output_mode(arg + 14);
    else if (arg[0] == '-' && (toupper(arg[1]) == 'W') && isdigit(arg[2]))
      ctx.suppressWaring(atoi(arg + 2));
    else if (arg[0] == '-' && isalpha(arg[1]))
      ctx.suppressWaring(arg + 1);
    else
      used = false;

    if (used)
      used_args.insert(i);
  }

  if (inverseWarnings)
    ctx.inverseWarningsSuppression();

  variable_presense_check = (!ctx.isWarningSuppressed("undefined-variable") ||
    !ctx.isWarningSuppressed("never-declared")) && use_csq;

  int expectWarningNumber = 0;
  bool expectError = false;


  if (file_name.empty())
  {
    CompilationContext::globalError("Expected file name");
    return 1;
  }

  if (source_code.empty())
  {
    ifstream tmp(file_name);
    if (tmp.fail())
    {
      CompilationContext::globalError((string("Cannot open file '") + file_name.c_str() + "'").c_str());
      return 1;
    }
    ctx.code = string((std::istreambuf_iterator<char>(tmp)), std::istreambuf_iterator<char>());
  }
  else
  {
    ctx.code = source_code;
  }

  ctx.setFileName(file_name);


  string sqconfigFileName = sqconfig_file_name.empty() ? settings::search_sqconfig(file_name.c_str()) : sqconfig_file_name;
  if (sqconfigFileName != settings::cur_config_file_name)
  {
    settings::reset();
    if (!sqconfigFileName.empty())
      if (!settings::append_from_file(sqconfigFileName.c_str()))
        return 1;
  }
  else if (settings::cur_config_file_failed)
  {
    return 1;
  }


  if (variable_presense_check)
    moduleexports::module_export_collector(ctx, 0, 0, nullptr);


  if (!strncmp(ctx.code.c_str(), "//expect:error", sizeof("//expect:error") - 1))
    expectError = true;

  if (!strncmp(ctx.code.c_str(), "//expect:w", sizeof("//expect:w") - 1))
    expectWarningNumber = atoi(ctx.code.c_str() + sizeof("//expect:w") - 1);

  if (expectError || expectWarningNumber)
    ctx.clearSuppressedWarnings();

  if ((printTokensToJson || printAstToJson) && !CompilationContext::redirectMessagesToJson)
  {
    ctx.clearSuppressedWarnings();
    ctx.inverseWarningsSuppression();
  }

  if (!process_import(ctx))
    return 1;

  Lexer lex(ctx);

  bool res = true;
  res = res && lex.process();

  if (printTokensToJson)
    res &= tokens_to_json(tokensFileName, lex);


  if (res)
  {
    Node * root = sq3_parse(lex); // do not delete, will be destroyed in ~CompilationContext()

    if (printAstToJson)
    {
      res &= ast_to_json(astFileName, root);
      res &= !ctx.isError;
    }

    if (root && printAst)
      root->print();


    if (!ctx.isError)
    {
      if (collect_ident_tree)
      {
        if (root)
        {
          collect_ever_declared(lex);
          global_collect_tree(root, &ident_root);
          return 0;
        }
      }
      else
      {
        Analyzer analyzer(lex);

        if (root)
        {
          collect_ever_declared(lex);
          analyzer.collectGlobalTables(root);
          analyzer.check(root);
          analyzer.checkVariables(root, 0, INT_MAX / 2, false, false, false, false, 1, false);
        }
      }
    }
  }

  if (ctx.isError || ctx.isWarning)
    res = false;

  if (expectError && !ctx.isError)
  {
    CompilationContext::globalError("Expected error.");
    return 1;
  }

  if (expectWarningNumber && (!ctx.isWarning || ctx.shownWarningsAndErrors.size() != 1 ||
    ctx.shownWarningsAndErrors[0] != expectWarningNumber))
  {
    CompilationContext::globalError((string("Expected only one warning 'w") +
      to_string(expectWarningNumber) + "' in file '" + ctx.fileName + "'").c_str());
    return 1;
  }

  if (expectError || expectWarningNumber)
  {
    if (CompilationContext::getErrorLevel() != ERRORLEVEL_FATAL)
      CompilationContext::clearErrorLevel();

    return 0;
  }

  return res ? 0 : 1;
}